

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O3

size_t aspa_collapse_as_path(uint32_t *as_path,size_t len)

{
  uint32_t *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = len;
  uVar6 = len;
  if (len == 1) {
LAB_001078e5:
    uVar5 = uVar4;
    if (uVar4 != len) {
      do {
        uVar6 = uVar4 + 1;
        if (uVar4 + 1 < len) {
          uVar6 = len;
        }
        uVar7 = uVar4;
        do {
          uVar4 = uVar6;
          if (uVar6 - 1 == uVar7) break;
          uVar4 = uVar7 + 1;
          puVar1 = as_path + uVar7;
          lVar3 = uVar7 + 1;
          uVar7 = uVar4;
        } while (*puVar1 == as_path[lVar3]);
        uVar6 = uVar5;
        if (uVar4 == len) break;
        as_path[uVar5] = as_path[uVar4];
        uVar5 = uVar5 + 1;
      } while( true );
    }
  }
  else if (len != 0) {
    uVar4 = 1;
    do {
      if (as_path[uVar4 - 1] == as_path[uVar4]) goto LAB_001078e5;
      uVar4 = uVar4 + 1;
    } while (len != uVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

RTRLIB_EXPORT size_t aspa_collapse_as_path(uint32_t as_path[], size_t len)
{
	if (len == 0)
		return 0;

	size_t i = 1;

	while (i < len && as_path[i - 1] != as_path[i])
		i++;

	if (i == len)
		return len;

	size_t j = i;

	i++;

	while (true) { // equivalent to while (i < len)
		while (i < len && as_path[i - 1] == as_path[i])
			i++;

		if (i == len)
			break;

		as_path[j++] = as_path[i++];
	}

	return j;
}